

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_info.cpp
# Opt level: O2

RegSet * __thiscall
mocker::LoopInfo::findLoopInvariantVariables
          (RegSet *__return_storage_ptr__,LoopInfo *this,FunctionModule *func,size_t header,
          UseDefChain *useDef,FuncAttr *funcAttr)

{
  _List_node_base *v;
  pointer psVar1;
  long lVar2;
  bool bVar3;
  BasicBlock *pBVar4;
  mapped_type *pmVar5;
  pointer psVar6;
  _List_node_base *p_Var7;
  shared_ptr<mocker::ir::Call> call;
  shared_ptr<mocker::ir::Reg> reg;
  shared_ptr<mocker::ir::Reg> dest;
  vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
  local_c0;
  long local_a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  shared_ptr<mocker::ir::IRInst> local_98;
  _Hashtable<std::shared_ptr<mocker::ir::Reg>,std::shared_ptr<mocker::ir::Reg>,std::allocator<std::shared_ptr<mocker::ir::Reg>>,std::__detail::_Identity,mocker::ir::RegPtrEqual,mocker::ir::RegPtrHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  *local_88;
  size_t local_80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_70;
  __node_base *local_68;
  mapped_type *local_60;
  _Map_base<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_58;
  _List_node_base *local_50;
  long local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  size_t local_38;
  
  local_58 = (_Map_base<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              *)useDef;
  local_38 = header;
  local_60 = std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)this,&local_38);
  (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket;
  (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
  (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_M_h)._M_element_count = 0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
  local_68 = &(local_60->_M_h)._M_before_begin;
  local_70 = &funcAttr->pureFuncs;
  local_88 = (_Hashtable<std::shared_ptr<mocker::ir::Reg>,std::shared_ptr<mocker::ir::Reg>,std::allocator<std::shared_ptr<mocker::ir::Reg>>,std::__detail::_Identity,mocker::ir::RegPtrEqual,mocker::ir::RegPtrHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)__return_storage_ptr__;
  do {
    local_68 = local_68->_M_nxt;
    if (local_68 == (__node_base *)0x0) {
      return (RegSet *)local_88;
    }
    pBVar4 = ir::FunctionModule::getBasicBlock(func,(size_t)local_68[1]._M_nxt);
    p_Var7 = (_List_node_base *)&pBVar4->insts;
    local_50 = p_Var7;
    while (p_Var7 = (((_List_base<std::shared_ptr<mocker::ir::IRInst>,_std::allocator<std::shared_ptr<mocker::ir::IRInst>_>_>
                       *)&p_Var7->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var7 != local_50) {
      v = p_Var7 + 1;
      ir::dyc<mocker::ir::Assign,std::shared_ptr<mocker::ir::IRInst>const&>
                ((ir *)&local_c0,(shared_ptr<mocker::ir::IRInst> *)v);
      if (local_c0.
          super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
LAB_0014fd33:
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &local_c0.
                    super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
        goto LAB_0014fd3d;
      }
      ir::dyc<mocker::ir::ArithUnaryInst,std::shared_ptr<mocker::ir::IRInst>const&>
                ((ir *)&local_a8,(shared_ptr<mocker::ir::IRInst> *)v);
      if (local_a8 != 0) {
LAB_0014fd29:
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0);
        goto LAB_0014fd33;
      }
      ir::dyc<mocker::ir::ArithBinaryInst,std::shared_ptr<mocker::ir::IRInst>const&>
                ((ir *)&local_98,(shared_ptr<mocker::ir::IRInst> *)v);
      if (local_98.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
LAB_0014fd1f:
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_98.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        goto LAB_0014fd29;
      }
      ir::dyc<mocker::ir::RelationInst,std::shared_ptr<mocker::ir::IRInst>const&>
                ((ir *)&local_80,(shared_ptr<mocker::ir::IRInst> *)v);
      if (local_80 != 0) {
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78);
        goto LAB_0014fd1f;
      }
      ir::dyc<mocker::ir::Call,std::shared_ptr<mocker::ir::IRInst>const&>
                ((ir *)&local_48,(shared_ptr<mocker::ir::IRInst> *)v);
      lVar2 = local_48;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_98.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &local_c0.
                  super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish);
      if (lVar2 != 0) {
LAB_0014fd3d:
        ir::dyc<mocker::ir::Call,std::shared_ptr<mocker::ir::IRInst>const&>
                  ((ir *)&local_c0,(shared_ptr<mocker::ir::IRInst> *)v);
        if ((local_c0.
             super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
             ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) ||
           (bVar3 = isIn<std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,std::__cxx11::string>
                              (local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&local_c0.
                                            super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[2].
                                            super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount), bVar3)) {
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     &local_c0.
                      super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
          ir::getDest(&local_98);
          if (local_98.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            ir::getOperandsUsed(&local_c0,(shared_ptr<mocker::ir::IRInst> *)v);
            psVar1 = local_c0.
                     super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (psVar6 = local_c0.
                          super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                          ._M_impl.super__Vector_impl_data._M_start; psVar6 != psVar1;
                psVar6 = psVar6 + 1) {
              ir::dycLocalReg((shared_ptr<mocker::ir::Addr> *)&local_a8);
              if ((((local_a8 != 0) && (bVar3 = isParameter(func,(string *)(local_a8 + 8)), !bVar3))
                  && (bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)(local_a8 + 8),".phi_nan"), !bVar3)) &&
                 (bVar3 = isIn<std::unordered_set<std::shared_ptr<mocker::ir::Reg>,mocker::ir::RegPtrHash,mocker::ir::RegPtrEqual,std::allocator<std::shared_ptr<mocker::ir::Reg>>>,std::shared_ptr<mocker::ir::Reg>>
                                    ((unordered_set<std::shared_ptr<mocker::ir::Reg>,_mocker::ir::RegPtrHash,_mocker::ir::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::ir::Reg>_>_>
                                      *)local_88,(shared_ptr<mocker::ir::Reg> *)&local_a8), !bVar3))
              {
                pmVar5 = std::__detail::
                         _Map_base<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_mocker::UseDefChain::Def>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         ::at(local_58,(key_type *)&local_a8);
                local_80 = pmVar5->bbLabel;
                bVar3 = isIn<std::unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>,unsigned_long>
                                  (local_60,&local_80);
                if (bVar3) {
                  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0);
                  std::
                  vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                  ::~vector(&local_c0);
                  goto LAB_0014fea3;
                }
              }
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0);
            }
            std::
            vector<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
            ::~vector(&local_c0);
            ir::dyc<mocker::ir::Call,std::shared_ptr<mocker::ir::IRInst>const&>
                      ((ir *)&local_c0,(shared_ptr<mocker::ir::IRInst> *)v);
            if ((local_c0.
                 super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                 ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) ||
               (bVar3 = isIn<std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>,std::__cxx11::string>
                                  (local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&local_c0.
                                                super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start[2].
                                                super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_refcount), bVar3)) {
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                         &local_c0.
                          super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
              std::
              _Hashtable<std::shared_ptr<mocker::ir::Reg>,std::shared_ptr<mocker::ir::Reg>,std::allocator<std::shared_ptr<mocker::ir::Reg>>,std::__detail::_Identity,mocker::ir::RegPtrEqual,mocker::ir::RegPtrHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              ::_M_emplace<std::shared_ptr<mocker::ir::Reg>&>(local_88,&local_98);
            }
            else {
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                         &local_c0.
                          super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish);
            }
          }
LAB_0014fea3:
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_98.super___shared_ptr<mocker::ir::IRInst,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
        else {
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     &local_c0.
                      super__Vector_base<std::shared_ptr<mocker::ir::Addr>,_std::allocator<std::shared_ptr<mocker::ir::Addr>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish);
        }
      }
    }
  } while( true );
}

Assistant:

ir::RegSet LoopInfo::findLoopInvariantVariables(const ir::FunctionModule &func,
                                                std::size_t header,
                                                const UseDefChain &useDef,
                                                const FuncAttr &funcAttr) {
  const auto &loopNodes = getLoops().at(header);

  ir::RegSet res;

  auto isLoopInvariant = [&res, &loopNodes, &useDef,
                          &func](const std::shared_ptr<ir::IRInst> &inst) {
    auto operands = ir::getOperandsUsed(inst);
    for (auto &operand : operands) {
      auto reg = ir::dycLocalReg(operand);
      if (!reg) {
        continue;
      }
      if (isParameter(func, reg->getIdentifier()) ||
          reg->getIdentifier() == ".phi_nan")
        continue;
      if (isIn(res, reg))
        continue;

      const auto &def = useDef.getDef(reg);
      if (isIn(loopNodes, def.getBBLabel())) {
        return false;
      }
    }
    return true;
  };

  for (auto node : loopNodes) {
    const auto &bb = func.getBasicBlock(node);
    for (auto &inst : bb.getInsts()) {
      if (!ir::dyc<ir::Assign>(inst) && !ir::dyc<ir::ArithUnaryInst>(inst) &&
          !ir::dyc<ir::ArithBinaryInst>(inst) &&
          !ir::dyc<ir::RelationInst>(inst) && !ir::dyc<ir::Call>(inst))
        continue;
      if (auto call = ir::dyc<ir::Call>(inst)) {
        if (!funcAttr.isPure(call->getFuncName()))
          continue;
      }
      auto dest = ir::getDest(inst);
      if (!dest)
        continue;
      if (!isLoopInvariant(inst))
        continue;
      if (auto call = ir::dyc<ir::Call>(inst)) {
        if (!funcAttr.isPure(call->getFuncName()))
          continue;
      }
      res.emplace(dest);
    }
  }

  return res;
}